

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

int test_setsockopt_impl
              (char *file,int line,int sock,int level,int option,void *optval,size_t optlen)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint *puVar4;
  int rc;
  void *optval_local;
  int option_local;
  int level_local;
  int sock_local;
  int line_local;
  char *file_local;
  
  iVar1 = nn_setsockopt(sock,level,option,optval,optlen);
  __stream = _stderr;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = nn_err_strerror(*piVar2);
    puVar4 = (uint *)__errno_location();
    fprintf(__stream,"Failed set option \"%d\": %s [%d] (%s:%d)\n",(ulong)(uint)option,pcVar3,
            (ulong)*puVar4,file,line);
    nn_err_abort();
  }
  return iVar1;
}

Assistant:

static int NN_UNUSED test_setsockopt_impl (char *file, int line,
    int sock, int level, int option, const void *optval, size_t optlen)
{
    int rc;

    rc = nn_setsockopt (sock, level, option, optval, optlen);
    if(rc < 0) {
        fprintf (stderr, "Failed set option \"%d\": %s [%d] (%s:%d)\n",
            option,
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }
    return rc;
}